

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

char * __thiscall skiwi::getenv(skiwi *this,char *__name)

{
  char *__s;
  allocator<char> local_9;
  
  __s = ::getenv(*(char **)__name);
  std::__cxx11::string::string<std::allocator<char>>((string *)this,__s,&local_9);
  return (char *)this;
}

Assistant:

std::string getenv(const std::string& name)
  {
#ifdef _WIN32
  std::wstring ws = convert_string_to_wstring(name);
  wchar_t* path = _wgetenv(ws.c_str());
  if (!path)
    return nullptr;
  std::wstring wresult(path);
  std::string out = convert_wstring_to_string(wresult);
#else
  std::string out(::getenv(name.c_str()));
#endif
  return out;
  }